

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::ExternalDefinition::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ExternalDefinition *this,EventRegistry *eventRegistry)

{
  LCC_LICENSE_DATA_TYPE LVar1;
  size_t sVar2;
  logic_error *this_00;
  char *szptr;
  string licData;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  declared_positions;
  char *local_58 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_location->licenseData[0] != '\0') {
    (**(this->super_LocatorStrategy)._vptr_LocatorStrategy)(&licData);
    EventRegistry::addEvent(eventRegistry,LICENSE_SPECIFIED,&licData);
    std::__cxx11::string::~string((string *)&licData);
    LVar1 = this->m_location->license_data_type;
    if (LVar1 - LICENSE_PLAIN_DATA < 2) {
      (**(this->super_LocatorStrategy)._vptr_LocatorStrategy)(&licData,this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&licData);
    }
    else {
      if (LVar1 != LICENSE_PATH) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"license type not supported ");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      szptr = this->m_location->licenseData;
      sVar2 = mstrnlen_s(szptr,0x1000);
      licData._M_dataplus._M_p = (pointer)&licData.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&licData,szptr,szptr + sVar2);
      split_string(&declared_positions,&licData,';');
      (**(this->super_LocatorStrategy)._vptr_LocatorStrategy)(local_58,this);
      filter_existing_files(&local_38,&declared_positions,eventRegistry,local_58[0]);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(__return_storage_ptr__,&local_38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38);
      std::__cxx11::string::~string((string *)local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&declared_positions);
    }
    std::__cxx11::string::~string((string *)&licData);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::string> ExternalDefinition::license_locations(EventRegistry &eventRegistry) {
	vector<string> existing_pos;
	if (m_location->licenseData[0] != '\0') {
		eventRegistry.addEvent(LICENSE_SPECIFIED, get_strategy_name());
		switch (m_location->license_data_type) {
			case LICENSE_PATH: {
				string licData(m_location->licenseData, mstrnlen_s(m_location->licenseData, LCC_API_MAX_LICENSE_DATA_LENGTH));
				const vector<string> declared_positions = license::split_string(licData, ';');
				existing_pos =
					license::filter_existing_files(declared_positions, eventRegistry, get_strategy_name().c_str());
			} break;
			case LICENSE_ENCODED:
			case LICENSE_PLAIN_DATA:
				existing_pos.push_back(get_strategy_name());
				break;
			default:
				throw logic_error("license type not supported ");
		}
	}
	return existing_pos;
}